

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_navigationbar.cpp
# Opt level: O0

int __thiscall QtMWidgets::NavigationBar::qt_metacall(NavigationBar *this,Call _c,int _id,void **_a)

{
  void **_a_local;
  int _id_local;
  Call _c_local;
  NavigationBar *this_local;
  
  _a_local._0_4_ = QWidget::qt_metacall((Call)this,_c,(void **)(ulong)(uint)_id);
  this_local._4_4_ = (int)_a_local;
  if (-1 < (int)_a_local) {
    if (_c == InvokeMetaMethod) {
      if ((int)_a_local < 4) {
        qt_static_metacall((QObject *)this,InvokeMetaMethod,(int)_a_local,_a);
      }
      _a_local._0_4_ = (int)_a_local + -4;
    }
    else if (_c == RegisterMethodArgumentMetaType) {
      if ((int)_a_local < 4) {
        qt_static_metacall((QObject *)this,RegisterMethodArgumentMetaType,(int)_a_local,_a);
      }
      _a_local._0_4_ = (int)_a_local + -4;
    }
    this_local._4_4_ = (int)_a_local;
  }
  return this_local._4_4_;
}

Assistant:

int QtMWidgets::NavigationBar::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QWidget::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 4)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 4;
    } else if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 4)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 4;
    }
    return _id;
}